

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GetUnionElement_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumVal *ev,bool native_type,
          IDLOptions *opts)

{
  BaseType BVar1;
  char *__s;
  string name;
  string sStack_68;
  string local_48;
  
  BVar1 = (ev->union_type).base_type;
  if (BVar1 == BASE_TYPE_STRING) {
    __s = "::flatbuffers::String";
    if (native_type) {
      __s = "std::string";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&sStack_68);
  }
  else {
    if (BVar1 != BASE_TYPE_STRUCT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x423,
                    "std::string flatbuffers::cpp::CppGenerator::GetUnionElement(const EnumVal &, bool, const IDLOptions &)"
                   );
    }
    std::__cxx11::string::string((string *)&sStack_68,(string *)(ev->union_type).struct_def);
    if (native_type) {
      NativeName(&local_48,&sStack_68,(ev->union_type).struct_def,opts);
      std::__cxx11::string::operator=((string *)&sStack_68,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    BaseGenerator::WrapInNameSpace
              (__return_storage_ptr__,&this->super_BaseGenerator,
               (((ev->union_type).struct_def)->super_Definition).defined_namespace,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetUnionElement(const EnumVal &ev, bool native_type,
                              const IDLOptions &opts) {
    if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
      std::string name = ev.union_type.struct_def->name;
      if (native_type) {
        name = NativeName(std::move(name), ev.union_type.struct_def, opts);
      }
      return WrapInNameSpace(ev.union_type.struct_def->defined_namespace, name);
    } else if (IsString(ev.union_type)) {
      return native_type ? "std::string" : "::flatbuffers::String";
    } else {
      FLATBUFFERS_ASSERT(false);
      return Name(ev);
    }
  }